

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderTextureSizeTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_1::TextureSizeCase::createTexture
          (TextureSizeCase *this,IVec3 *size)

{
  code *pcVar1;
  int iVar2;
  GLenum GVar3;
  deUint32 dVar4;
  GLenum GVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  RenderContext *pRVar9;
  undefined4 extraout_var;
  TestLog *pTVar10;
  MessageBuilder *pMVar11;
  int local_344;
  int local_340;
  int local_33c;
  MessageBuilder local_338;
  int local_1b4;
  int local_1b0 [4];
  MessageBuilder local_1a0;
  long local_20;
  Functions *gl;
  IVec3 *size_local;
  TextureSizeCase *this_local;
  
  gl = (Functions *)size;
  size_local = (IVec3 *)this;
  pRVar9 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  iVar2 = (*pRVar9->_vptr_RenderContext[3])();
  local_20 = CONCAT44(extraout_var,iVar2);
  if ((this->m_isArrayType & 1U) == 0) {
    pTVar10 = tcu::TestContext::getLog
                        ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_1a0,pTVar10,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar11 = tcu::MessageBuilder::operator<<
                        (&local_1a0,(char (*) [28])"Creating texture with size ");
    local_1b0[0] = tcu::Vector<int,_3>::x((Vector<int,_3> *)gl);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,local_1b0);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [2])0x2a8224a);
    local_1b4 = tcu::Vector<int,_3>::y((Vector<int,_3> *)gl);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_1b4);
    tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1a0);
  }
  else {
    pTVar10 = tcu::TestContext::getLog
                        ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_338,pTVar10,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar11 = tcu::MessageBuilder::operator<<
                        (&local_338,(char (*) [28])"Creating texture with size ");
    local_33c = tcu::Vector<int,_3>::x((Vector<int,_3> *)gl);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_33c);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [2])0x2a8224a);
    local_340 = tcu::Vector<int,_3>::y((Vector<int,_3> *)gl);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_340);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [2])0x2a8224a);
    local_344 = tcu::Vector<int,_3>::z((Vector<int,_3> *)gl);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_344);
    tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_338);
  }
  (**(code **)(local_20 + 0x6f8))(1,&this->m_texture);
  pcVar1 = *(code **)(local_20 + 0xb8);
  GVar3 = getTextureGLTarget(this);
  (*pcVar1)(GVar3,this->m_texture);
  dVar4 = (**(code **)(local_20 + 0x800))();
  glu::checkError(dVar4,"texture gen",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderTextureSizeTests.cpp"
                  ,0x195);
  if ((this->m_isArrayType & 1U) == 0) {
    pcVar1 = *(code **)(local_20 + 0x1390);
    GVar3 = getTextureGLTarget(this);
    iVar2 = this->m_numSamples;
    GVar5 = getTextureGLInternalFormat(this);
    iVar6 = tcu::Vector<int,_3>::x((Vector<int,_3> *)gl);
    iVar7 = tcu::Vector<int,_3>::y((Vector<int,_3> *)gl);
    (*pcVar1)(GVar3,iVar2,GVar5,iVar6,iVar7,0);
  }
  else {
    pcVar1 = *(code **)(local_20 + 0x13a8);
    GVar3 = getTextureGLTarget(this);
    iVar2 = this->m_numSamples;
    GVar5 = getTextureGLInternalFormat(this);
    iVar6 = tcu::Vector<int,_3>::x((Vector<int,_3> *)gl);
    iVar7 = tcu::Vector<int,_3>::y((Vector<int,_3> *)gl);
    iVar8 = tcu::Vector<int,_3>::z((Vector<int,_3> *)gl);
    (*pcVar1)(GVar3,iVar2,GVar5,iVar6,iVar7,iVar8,0);
  }
  dVar4 = (**(code **)(local_20 + 0x800))();
  glu::checkError(dVar4,"texStorage",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderTextureSizeTests.cpp"
                  ,0x19b);
  return;
}

Assistant:

void TextureSizeCase::createTexture (const tcu::IVec3& size)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	if (!m_isArrayType)
		m_testCtx.getLog() << tcu::TestLog::Message << "Creating texture with size " << size.x() << "x" << size.y() << tcu::TestLog::EndMessage;
	else
		m_testCtx.getLog() << tcu::TestLog::Message << "Creating texture with size " << size.x() << "x" << size.y() << "x" << size.z() << tcu::TestLog::EndMessage;

	gl.genTextures(1, &m_texture);
	gl.bindTexture(getTextureGLTarget(), m_texture);
	GLU_EXPECT_NO_ERROR(gl.getError(), "texture gen");

	if (!m_isArrayType)
		gl.texStorage2DMultisample(getTextureGLTarget(), m_numSamples, getTextureGLInternalFormat(), size.x(), size.y(), GL_FALSE);
	else
		gl.texStorage3DMultisample(getTextureGLTarget(), m_numSamples, getTextureGLInternalFormat(), size.x(), size.y(), size.z(), GL_FALSE);
	GLU_EXPECT_NO_ERROR(gl.getError(), "texStorage");
}